

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c140.c
# Opt level: O0

void c140_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  uint uVar1;
  uint uVar2;
  DEV_SMPL *__s;
  DEV_SMPL *__s_00;
  int iVar3;
  UINT32 UVar4;
  int iVar5;
  uint uVar6;
  uint *puVar7;
  byte *pbVar8;
  long lVar9;
  voice_registers *vreg;
  C140_VOICE *v;
  DEV_SMPL *rmix;
  DEV_SMPL *lmix;
  UINT32 cnt;
  INT32 delta;
  INT32 frequency;
  UINT8 *pSampleData;
  INT32 sz;
  INT32 dt;
  UINT32 j;
  UINT32 i;
  c140_state *info;
  DEV_SMPL **outputs_local;
  UINT32 samples_local;
  void *param_local;
  
  __s = *outputs;
  __s_00 = outputs[1];
  memset(__s,0,(ulong)samples << 2);
  memset(__s_00,0,(ulong)samples << 2);
  if (*(long *)((long)param + 0x20) != 0) {
    for (dt = 0; (uint)dt < 0x18; dt = dt + 1) {
      puVar7 = (uint *)((long)param + (ulong)(uint)dt * 0x24 + 0x428);
      pbVar8 = (byte *)((long)param + (ulong)(uint)(dt << 4) + 0x28);
      if ((((char)puVar7[8] != '\0') && (*(char *)((long)puVar7 + 0x21) == '\0')) &&
         (CONCAT11(pbVar8[2],pbVar8[3]) != 0)) {
        iVar3 = (int)((float)CONCAT11(pbVar8[2],pbVar8[3]) * *(float *)((long)param + 0x10));
        uVar1 = puVar7[6];
        uVar2 = puVar7[5];
        lVar9 = *(long *)((long)param + 0x20);
        UVar4 = find_sample((c140_state *)param,puVar7[5],pbVar8[4],dt);
        lVar9 = lVar9 + (ulong)UVar4;
        if ((pbVar8[5] & 8) == 0) {
          for (sz = 0; (uint)sz < samples; sz = sz + 1) {
            *puVar7 = iVar3 + *puVar7;
            uVar6 = (int)*puVar7 >> 0x10 & 0x7fff;
            *puVar7 = *puVar7 & 0xffff;
            puVar7[1] = uVar6 + puVar7[1];
            if ((int)(uVar1 - uVar2) <= (int)puVar7[1]) {
              if ((pbVar8[5] & 0x10) == 0) {
                *(undefined1 *)(puVar7 + 8) = 0;
                break;
              }
              puVar7[1] = puVar7[7] - puVar7[5];
            }
            if (uVar6 != 0) {
              puVar7[3] = puVar7[2];
              puVar7[2] = (int)*(char *)(lVar9 + (int)puVar7[1]) << 8;
              puVar7[4] = puVar7[2] - puVar7[3];
            }
            iVar5 = ((int)(puVar7[4] * *puVar7) >> 0x10) + puVar7[3];
            __s[(uint)sz] = ((int)(iVar5 * (uint)pbVar8[1]) >> 8) + __s[(uint)sz];
            __s_00[(uint)sz] = ((int)(iVar5 * (uint)*pbVar8) >> 8) + __s_00[(uint)sz];
          }
        }
        else {
          for (sz = 0; (uint)sz < samples; sz = sz + 1) {
            *puVar7 = iVar3 + *puVar7;
            uVar6 = *puVar7;
            *puVar7 = *puVar7 & 0xffff;
            puVar7[1] = ((int)uVar6 >> 0x10 & 0x7fffU) + puVar7[1];
            if ((int)(uVar1 - uVar2) <= (int)puVar7[1]) {
              if ((pbVar8[5] & 0x10) == 0) {
                *(undefined1 *)(puVar7 + 8) = 0;
                break;
              }
              puVar7[1] = puVar7[7] - puVar7[5];
            }
            puVar7[3] = puVar7[2];
            puVar7[2] = (int)*(short *)((long)param +
                                       (ulong)*(byte *)(lVar9 + (int)puVar7[1]) * 2 + 0x228);
            puVar7[4] = puVar7[2] - puVar7[3];
            iVar5 = ((int)(puVar7[4] * *puVar7) >> 0x10) + puVar7[3];
            __s[(uint)sz] = ((int)(iVar5 * (uint)pbVar8[1]) >> 8) + __s[(uint)sz];
            __s_00[(uint)sz] = ((int)(iVar5 * (uint)*pbVar8) >> 8) + __s_00[(uint)sz];
          }
        }
      }
    }
  }
  return;
}

Assistant:

static void c140_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	c140_state *info = (c140_state *)param;
	UINT32  i,j;

	INT32   dt;
	INT32   sz;

	UINT8   *pSampleData;
	INT32   frequency,delta;
	UINT32  cnt;

	DEV_SMPL *lmix, *rmix;

	/* Set mixer outputs base pointers */
	lmix = outputs[0];
	rmix = outputs[1];

	/* zap the contents of the mixer buffer */
	memset(lmix, 0, samples * sizeof(DEV_SMPL));
	memset(rmix, 0, samples * sizeof(DEV_SMPL));
	if (info->pRom == NULL)
		return;

	//--- audio update
	for( i=0;i<MAX_VOICE;i++ )
	{
		C140_VOICE *v = &info->voi[i];
		const struct voice_registers *vreg = (struct voice_registers *)&info->REG[i*16];

		if( v->key && ! v->Muted)
		{
			frequency = (vreg->frequency_msb<<8) | vreg->frequency_lsb;

			/* Abort voice if no frequency value set */
			if(frequency==0) continue;

			/* Delta =  frequency * ((8MHz/374)*2 / sample rate) */
			delta=(INT32)((float)frequency * info->pbase);

			/* calculate sample size */
			sz=v->sample_end-v->sample_start;

			/* Retrieve base pointer to the sample data */
			pSampleData = info->pRom + find_sample(info, v->sample_start, vreg->bank, i);

			/* Switch on data type - compressed PCM is only for C140 */
			if (vreg->mode&C140_MODE_MULAW)
			{
				//compressed PCM (maybe correct...)
				/* Loop for enough to fill sample buffer as requested */
				for(j=0;j<samples;j++)
				{
					v->ptoffset += delta;
					cnt = (v->ptoffset>>16)&0x7fff;
					v->ptoffset &= 0xffff;
					v->pos+=cnt;
					//for(;cnt>0;cnt--)
					{
						/* Check for the end of the sample */
						if(v->pos >= sz)
						{
							/* Check if its a looping sample, either stop or loop */
							if(vreg->mode&C140_MODE_LOOP)
							{
								v->pos = v->sample_loop - v->sample_start;
							}
							else
							{
								v->key=0;
								break;
							}
						}

						v->prevdt=v->lastdt;
						v->lastdt=info->mulaw_table[pSampleData[v->pos]];
						v->dltdt=(v->lastdt - v->prevdt);
					}

					/* Caclulate the sample value */
					dt=((v->dltdt*v->ptoffset)>>16)+v->prevdt;

					/* Write the data to the sample buffers */
					lmix[j]+=(dt*vreg->volume_left)>>8;
					rmix[j]+=(dt*vreg->volume_right)>>8;
				}
			}
			else
			{
				/* linear 8bit signed PCM */
				for(j=0;j<samples;j++)
				{
					v->ptoffset += delta;
					cnt = (v->ptoffset>>16)&0x7fff;
					v->ptoffset &= 0xffff;
					v->pos += cnt;
					/* Check for the end of the sample */
					if(v->pos >= sz)
					{
						/* Check if its a looping sample, either stop or loop */
						if( vreg->mode&C140_MODE_LOOP )
						{
							v->pos = v->sample_loop - v->sample_start;
						}
						else
						{
							v->key=0;
							break;
						}
					}

					if( cnt )
					{
						v->prevdt=v->lastdt;
						v->lastdt=(INT8)pSampleData[v->pos]<<8;
						v->dltdt = (v->lastdt - v->prevdt);
					}

					/* Caclulate the sample value */
					dt=((v->dltdt*v->ptoffset)>>16)+v->prevdt;

					/* Write the data to the sample buffers */
					lmix[j]+=(dt*vreg->volume_left)>>8;
					rmix[j]+=(dt*vreg->volume_right)>>8;
				}
			}
		}
	}
}